

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * get_ssl_version_txt(SSL *ssl)

{
  int iVar1;
  SSL *ssl_local;
  
  if (ssl == (SSL *)0x0) {
    ssl_local = (SSL *)0x164c86;
  }
  else {
    iVar1 = SSL_version((SSL *)ssl);
    if (iVar1 == 2) {
      ssl_local = (SSL *)anon_var_dwarf_751eb;
    }
    else if (iVar1 == 0x300) {
      ssl_local = (SSL *)anon_var_dwarf_75202;
    }
    else if (iVar1 == 0x301) {
      ssl_local = (SSL *)anon_var_dwarf_7520d;
    }
    else if (iVar1 == 0x302) {
      ssl_local = (SSL *)anon_var_dwarf_75218;
    }
    else if (iVar1 == 0x303) {
      ssl_local = (SSL *)anon_var_dwarf_75223;
    }
    else if (iVar1 == 0x304) {
      ssl_local = (SSL *)anon_var_dwarf_7522e;
    }
    else {
      ssl_local = (SSL *)0x16879c;
    }
  }
  return (char *)ssl_local;
}

Assistant:

static const char *
get_ssl_version_txt(SSL *ssl)
{
  if(!ssl)
    return "";

  switch(SSL_version(ssl)) {
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    return "TLSv1.3";
#endif
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
  case TLS1_2_VERSION:
    return "TLSv1.2";
  case TLS1_1_VERSION:
    return "TLSv1.1";
#endif
  case TLS1_VERSION:
    return "TLSv1.0";
  case SSL3_VERSION:
    return "SSLv3";
  case SSL2_VERSION:
    return "SSLv2";
  }
  return "unknown";
}